

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.hpp
# Opt level: O2

void print_cnt(vector<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
               *w)

{
  ostream *poVar1;
  pointer pvVar2;
  int i;
  ulong uVar3;
  int j;
  ulong uVar4;
  
  uVar3 = 0;
  while( true ) {
    pvVar2 = (w->
             super__Vector_base<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(w->
                       super__Vector_base<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <= uVar3)
    break;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar2->
                                       super__Vector_base<tensor_*,_std::allocator<tensor_*>_>).
                                       _M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(pvVar2->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>).
                                  _M_impl.super__Vector_impl_data >> 3); uVar4 = uVar4 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)(*(long *)&pvVar2[uVar3].
                                                                                                              
                                                  super__Vector_base<tensor_*,_std::allocator<tensor_*>_>
                                                  ._M_impl + uVar4 * 8) + 0x10));
      std::operator<<(poVar1," ");
      pvVar2 = (w->
               super__Vector_base<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void print_cnt(vector<vector<tensor *>> w){
    for(int i=0;i<w.size();i++){
        for(int j=0;j<w[0].size();j++){
            cout<<w[i][j]->cnt<<" ";
        }
        cout<<endl;
    }
//    for(int i=0;i<w.size();i++){
//        for(int j=0;j<w[0].size();j++){
//            cout<<w[i][j]->grad<<" ";
//        }
//        cout<<endl;
//    }
}